

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::acceptAuthenticated
          (AggregateConnectionReceiver *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  PromiseArenaMember *node;
  void *pvVar5;
  Promise<kj::AuthenticatedStream> *result;
  size_t in_RSI;
  long lVar6;
  long lVar7;
  PromiseNode *ptrCopy;
  ConnectionReceiver local_40;
  Own<kj::ConnectionReceiver,_std::nullptr_t> *local_38;
  
  puVar1 = *(undefined8 **)(in_RSI + 0x60);
  if (*(undefined8 **)(in_RSI + 0x80) == puVar1) {
    pvVar5 = operator_new(0x400);
    local_38 = (Own<kj::ConnectionReceiver,_std::nullptr_t> *)((long)pvVar5 + 0x1f8);
    *(undefined8 *)((long)pvVar5 + 0x208) = 0;
    *(undefined ***)((long)pvVar5 + 0x1f8) = &PTR_destroy_00624208;
    *(undefined ***)((long)pvVar5 + 0x210) = &PTR_reject_00624258;
    *(undefined1 *)((long)pvVar5 + 0x218) = 0;
    *(undefined1 *)((long)pvVar5 + 0x3b0) = 0;
    *(undefined1 *)((long)pvVar5 + 0x3d8) = 1;
    *(long *)((long)pvVar5 + 0x3e0) = (long)pvVar5 + 0x210;
    *(size_t *)((long)pvVar5 + 1000) = in_RSI;
    *(undefined8 *)((long)pvVar5 + 0x3f0) = 0;
    plVar2 = *(long **)(in_RSI + 0x40);
    *plVar2 = (long)pvVar5 + 0x3e0;
    *(long **)((long)pvVar5 + 0x3f8) = plVar2;
    *(long *)(in_RSI + 0x40) = (long)pvVar5 + 0x3f0;
    *(long *)(in_RSI + 0x48) = *(long *)(in_RSI + 0x48) + 1;
    *(void **)((long)pvVar5 + 0x200) = pvVar5;
    (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)local_38;
    lVar3 = *(long *)(in_RSI + 0x10);
    if (lVar3 != 0) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        if (*(char *)(*(long *)(in_RSI + 0x20) + lVar7) == '\0') {
          acceptLoop((AggregateConnectionReceiver *)&stack0xffffffffffffffc0,in_RSI);
          lVar4 = *(long *)(in_RSI + 0x20);
          if (*(char *)(lVar4 + lVar7) == '\x01') {
            *(undefined1 *)(lVar4 + lVar7) = 0;
            node = *(PromiseArenaMember **)(lVar4 + 8 + lVar7);
            if (node != (PromiseArenaMember *)0x0) {
              *(undefined8 *)(lVar4 + 8 + lVar7) = 0;
              kj::_::PromiseDisposer::dispose(node);
            }
          }
          *(_func_int ***)(lVar4 + 8 + lVar7) = local_40._vptr_ConnectionReceiver;
          *(undefined1 *)(lVar4 + lVar7) = 1;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar3 != lVar6);
    }
  }
  else {
    (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)*puVar1;
    *puVar1 = 0;
    std::
    deque<kj::Promise<kj::AuthenticatedStream>,_std::allocator<kj::Promise<kj::AuthenticatedStream>_>_>
    ::pop_front((deque<kj::Promise<kj::AuthenticatedStream>,_std::allocator<kj::Promise<kj::AuthenticatedStream>_>_>
                 *)(in_RSI + 0x50));
  }
  return (Promise<kj::AuthenticatedStream>)this;
}

Assistant:

Promise<AuthenticatedStream> acceptAuthenticated() override {
    // Whenever our accept() is called, we want it to resolve to the first connection accepted by
    // any of our child receivers. Naively, it may seem like we should call accept() on them all
    // and exclusiveJoin() the results. Unfortunately, this might not work in a certain race
    // condition: if two or more of our children receive connections simultaneously, both child
    // accept() calls may return, but we'll only end up taking one and dropping the other.
    //
    // To avoid this problem, we must instead initiate `accept()` calls on all children, and even
    // after one of them returns a result, we must allow the others to keep running. If we end up
    // accepting any sockets from children when there is no outstanding accept() on the aggregate,
    // we must put that socket into a backlog. We only restart accept() calls on children if the
    // backlog is empty, and hence the maximum length of the backlog is the number of children
    // minus 1.

    if (backlog.empty()) {
      auto result = kj::newAdaptedPromise<AuthenticatedStream, Waiter>(*this);
      ensureAllAccepting();
      return result;
    } else {
      auto result = kj::mv(backlog.front());
      backlog.pop_front();
      return result;
    }
  }